

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcCrossProductsStates
          (BeagleCPUImpl<float,_1,_0> *this,int *tipStates,float *preOrderPartial,
          double *categoryRates,float *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  float *pfVar1;
  pointer pfVar2;
  double *pdVar3;
  float fVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  ulong uVar17;
  long lVar18;
  pointer pfVar19;
  double *pdVar20;
  long lVar21;
  float *pfVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int j;
  ulong uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined8 in_XMM7_Qb;
  vector<float,_std::allocator<float>_> tmp;
  allocator_type local_89;
  BeagleCPUImpl<float,_1,_0> *local_88;
  long local_80;
  float *local_78;
  value_type_conflict3 local_6c;
  double local_68;
  double *local_60;
  float *local_58;
  int *local_50;
  vector<float,_std::allocator<float>_> local_48;
  
  if (0 < this->kPatternCount) {
    lVar23 = 0;
    local_80 = 0;
    local_88 = this;
    local_78 = preOrderPartial;
    local_68 = edgeLength;
    local_60 = categoryRates;
    local_58 = categoryWeights;
    local_50 = tipStates;
    do {
      local_6c = 0.0;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_48,(ulong)(uint)(local_88->kStateCount * local_88->kStateCount),&local_6c,
                 &local_89);
      lVar18 = (long)local_50[lVar23];
      uVar6 = local_88->kStateCount;
      uVar17 = (ulong)uVar6;
      uVar7 = local_88->kCategoryCount;
      if (local_50[lVar23] < (int)uVar6) {
        if ((int)uVar7 < 1) {
          dVar34 = 0.0;
        }
        else {
          iVar8 = local_88->kPatternCount;
          lVar21 = (long)local_88->kPartialsPaddedStateCount;
          auVar38 = ZEXT864(0);
          uVar24 = 0;
          pfVar22 = (float *)(local_80 * lVar21 + (long)local_78);
          do {
            fVar4 = local_58[uVar24];
            auVar36 = vfmadd231ss_fma(auVar38._0_16_,ZEXT416((uint)fVar4),
                                      ZEXT416((uint)local_78[lVar18 + (uVar24 * (long)iVar8 + lVar23
                                                                      ) * lVar21]));
            auVar38 = ZEXT1664(auVar36);
            if (0 < (int)uVar6) {
              uVar26 = 0;
              auVar35._0_4_ = (float)((double)(float)local_60[uVar24] * local_68);
              auVar35._4_4_ = (int)((ulong)((double)(float)local_60[uVar24] * local_68) >> 0x20);
              auVar35._8_8_ = 0;
              pfVar19 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar18;
              do {
                pfVar1 = pfVar22 + uVar26;
                uVar26 = uVar26 + 1;
                auVar33 = vfmadd213ss_fma(ZEXT416((uint)(fVar4 * *pfVar1)),auVar35,
                                          ZEXT416((uint)*pfVar19));
                *pfVar19 = auVar33._0_4_;
                pfVar19 = pfVar19 + (int)uVar6;
              } while (uVar17 != uVar26);
            }
            uVar24 = uVar24 + 1;
            pfVar22 = pfVar22 + iVar8 * lVar21;
          } while (uVar24 != uVar7);
          dVar34 = (double)auVar36._0_4_;
        }
        if (0 < (int)uVar6) {
          lVar18 = lVar18 << 2;
          lVar21 = uVar17 * 4;
          auVar31._0_8_ = local_88->gPatternWeights[lVar23] / dVar34;
          auVar31._8_8_ = 0;
          do {
            auVar32._0_8_ =
                 (double)*(float *)((long)local_48.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar18);
            auVar32._8_8_ = in_XMM7_Qb;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)((long)outCrossProducts + lVar18 * 2);
            auVar36 = vfmadd213sd_fma(auVar32,auVar31,auVar5);
            *(long *)((long)outCrossProducts + lVar18 * 2) = auVar36._0_8_;
            lVar18 = lVar18 + lVar21;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
          goto LAB_0013ac19;
        }
LAB_0013ac14:
        if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0013ac19;
      }
      else {
        if ((int)uVar7 < 1) {
          auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          dVar34 = 0.0;
        }
        else {
          lVar18 = (long)local_88->kPartialsPaddedStateCount;
          iVar8 = local_88->kPatternCount;
          auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar39 = ZEXT864(0);
          uVar24 = 0;
          pfVar22 = (float *)(local_80 * lVar18 + (long)local_78);
          do {
            fVar4 = local_58[uVar24];
            if ((int)uVar6 < 1) {
              auVar36 = vfmadd231ss_fma(auVar39._0_16_,ZEXT816(0) << 0x40,ZEXT416((uint)fVar4));
              auVar39 = ZEXT1664(auVar36);
            }
            else {
              auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
              uVar26 = 0;
              auVar36._0_4_ = (float)((double)(float)local_60[uVar24] * local_68);
              auVar36._4_4_ = (int)((ulong)((double)(float)local_60[uVar24] * local_68) >> 0x20);
              auVar36._8_8_ = 0;
              do {
                fVar16 = auVar37._0_4_ + pfVar22[uVar26];
                auVar37 = ZEXT464((uint)fVar16);
                uVar26 = uVar26 + 1;
              } while (uVar17 != uVar26);
              auVar33 = vfmadd231ss_fma(auVar39._0_16_,ZEXT416((uint)fVar4),ZEXT416((uint)fVar16));
              auVar39 = ZEXT1664(auVar33);
              if (0 < (int)uVar6) {
                uVar25 = 0;
                uVar26 = 0;
                do {
                  uVar27 = 0;
                  do {
                    auVar33 = vfmadd213ss_fma(ZEXT416((uint)(fVar4 * local_78[(uVar24 * (long)iVar8
                                                                              + lVar23) * lVar18 +
                                                                              uVar26])),auVar36,
                                              ZEXT416((uint)local_48.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [uVar25 + uVar27]));
                    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar25 + uVar27] = auVar33._0_4_;
                    uVar27 = uVar27 + 1;
                  } while (uVar17 != uVar27);
                  uVar26 = uVar26 + 1;
                  uVar25 = (ulong)((int)uVar25 + uVar6);
                } while (uVar26 != uVar17);
              }
            }
            uVar24 = uVar24 + 1;
            pfVar22 = pfVar22 + iVar8 * lVar18;
          } while (uVar24 != uVar7);
          dVar34 = (double)auVar39._0_4_;
        }
        if ((int)uVar6 < 1) goto LAB_0013ac14;
        uVar24 = 0;
        auVar39 = vpbroadcastq_avx512f();
        auVar33._0_8_ = local_88->gPatternWeights[lVar23] / dVar34;
        auVar33._8_8_ = 0;
        auVar37 = vbroadcastsd_avx512f(auVar33);
        pfVar19 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar20 = outCrossProducts;
        do {
          uVar26 = 0;
          do {
            auVar29 = vpbroadcastq_avx512f();
            auVar29 = vporq_avx512f(auVar29,auVar38);
            uVar25 = vpcmpuq_avx512f(auVar29,auVar39,2);
            pfVar2 = pfVar19 + uVar26;
            bVar9 = (byte)uVar25;
            auVar28._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * (int)pfVar2[1];
            auVar28._0_4_ = (uint)(bVar9 & 1) * (int)*pfVar2;
            auVar28._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * (int)pfVar2[2];
            auVar28._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * (int)pfVar2[3];
            auVar28._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * (int)pfVar2[4];
            auVar28._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * (int)pfVar2[5];
            auVar28._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * (int)pfVar2[6];
            auVar28._28_4_ = (uint)(byte)(uVar25 >> 7) * (int)pfVar2[7];
            pdVar3 = pdVar20 + uVar26;
            auVar29._8_8_ = (ulong)((byte)(uVar25 >> 1) & 1) * (long)pdVar3[1];
            auVar29._0_8_ = (ulong)(bVar9 & 1) * (long)*pdVar3;
            auVar29._16_8_ = (ulong)((byte)(uVar25 >> 2) & 1) * (long)pdVar3[2];
            auVar29._24_8_ = (ulong)((byte)(uVar25 >> 3) & 1) * (long)pdVar3[3];
            auVar29._32_8_ = (ulong)((byte)(uVar25 >> 4) & 1) * (long)pdVar3[4];
            auVar29._40_8_ = (ulong)((byte)(uVar25 >> 5) & 1) * (long)pdVar3[5];
            auVar29._48_8_ = (ulong)((byte)(uVar25 >> 6) & 1) * (long)pdVar3[6];
            auVar29._56_8_ = (uVar25 >> 7) * (long)pdVar3[7];
            auVar30 = vcvtps2pd_avx512f(auVar28);
            auVar29 = vfmadd231pd_avx512f(auVar29,auVar37,auVar30);
            pdVar3 = pdVar20 + uVar26;
            bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar25 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar25 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar25 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar25 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar25 >> 6) & 1);
            *pdVar3 = (double)((ulong)(bVar9 & 1) * auVar29._0_8_ |
                              (ulong)!(bool)(bVar9 & 1) * (long)*pdVar3);
            pdVar3[1] = (double)((ulong)bVar10 * auVar29._8_8_ | (ulong)!bVar10 * (long)pdVar3[1]);
            pdVar3[2] = (double)((ulong)bVar11 * auVar29._16_8_ | (ulong)!bVar11 * (long)pdVar3[2]);
            pdVar3[3] = (double)((ulong)bVar12 * auVar29._24_8_ | (ulong)!bVar12 * (long)pdVar3[3]);
            pdVar3[4] = (double)((ulong)bVar13 * auVar29._32_8_ | (ulong)!bVar13 * (long)pdVar3[4]);
            pdVar3[5] = (double)((ulong)bVar14 * auVar29._40_8_ | (ulong)!bVar14 * (long)pdVar3[5]);
            pdVar3[6] = (double)((ulong)bVar15 * auVar29._48_8_ | (ulong)!bVar15 * (long)pdVar3[6]);
            pdVar3[7] = (double)((uVar25 >> 7) * auVar29._56_8_ |
                                (ulong)!SUB81(uVar25 >> 7,0) * (long)pdVar3[7]);
            uVar26 = uVar26 + 8;
          } while ((uVar6 + 7 & 0xfffffff8) != uVar26);
          uVar24 = uVar24 + 1;
          pdVar20 = pdVar20 + uVar17;
          pfVar19 = pfVar19 + uVar17;
        } while (uVar24 != uVar17);
LAB_0013ac19:
        operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_80 = local_80 + 4;
      lVar23 = lVar23 + 1;
    } while (lVar23 < local_88->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(const int *tipStates,
                                                                const REALTYPE *preOrderPartial,
                                                                const double *categoryRates,
                                                                const REALTYPE *categoryWeights,
                                                                const double edgeLength,
                                                                double *outCrossProducts,
                                                                double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        const int state = tipStates[pattern];

        if (state < kStateCount) {

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = preOrderPartial[v + state];
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    tmp[k * kStateCount + state] += preOrderPartial[v + k] * weight * scale;
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                outCrossProducts[k * kStateCount + state] += tmp[k * kStateCount + state] * patternWeight;
            }

        } else { // Missing character

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = 0.0;
                for (int k = 0; k < kStateCount; k++) {
                    denominator += preOrderPartial[v + k];
                }
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    for (int j = 0; j < kStateCount; j++) {
                        tmp[k * kStateCount + j] += preOrderPartial[v + k] * weight * scale;
                    }
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
                }
            }
        }
    }
}